

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O2

void __thiscall http_server::http_server(http_server *this,epoll *ep)

{
  _Rb_tree_header *p_Var1;
  on_connected_t oStack_58;
  _Bind<void_(http_server::*(http_server_*))()> local_38;
  
  this->ep = ep;
  local_38._M_f = (offset_in_http_server_to_subr)on_new_connection;
  local_38._8_8_ = 0;
  local_38._M_bound_args.super__Tuple_impl<0UL,_http_server_*>.
  super__Head_base<0UL,_http_server_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_http_server_*>)(_Tuple_impl<0UL,_http_server_*>)this;
  std::function<void()>::function<std::_Bind<void(http_server::*(http_server*))()>,void>
            ((function<void()> *)&oStack_58,&local_38);
  server_socket::server_socket(&this->ss,ep,&oStack_58);
  std::_Function_base::~_Function_base(&oStack_58.super__Function_base);
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

http_server::http_server(sysapi::epoll &ep)
    : ep(ep)
    , ss{ep, std::bind(&http_server::on_new_connection, this)}
{}